

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::~ExplicitProducer(ExplicitProducer *this)

{
  int *piVar1;
  FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar2;
  atomic<unsigned_int> *paVar3;
  __int_type_conflict3 _Var4;
  int iVar5;
  long *plVar6;
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *pCVar7;
  void *pvVar8;
  void *__ptr;
  ulong uVar9;
  ulong uVar10;
  __pointer_type pBVar11;
  __pointer_type pBVar12;
  Block *pBVar13;
  Block *pBVar14;
  bool bVar15;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_024a9e90;
  pBVar13 = (this->super_ProducerBase).tailBlock;
  if (pBVar13 != (Block *)0x0) {
    if (((this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) == 0)
    {
      pBVar14 = (Block *)0x0;
    }
    else {
      uVar9 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar10 = uVar9 & this->pr_blockIndexSize - 1;
        uVar9 = uVar10 + 1;
      } while (0x8000000000000000 <
               (this->pr_blockIndexEntries[uVar10].base -
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i) + 0x20)
      ;
      pBVar14 = this->pr_blockIndexEntries[uVar10].block;
    }
    do {
      pBVar13 = pBVar13->next;
      if ((pBVar13->emptyFlags[0]._M_base._M_i & 1U) == 0) {
        bVar15 = false;
      }
      else {
        uVar9 = 0;
        do {
          uVar10 = uVar9;
          bVar15 = 0x1e < uVar10;
          if (uVar10 == 0x1f) goto LAB_01702b53;
          uVar9 = uVar10 + 1;
        } while ((pBVar13->emptyFlags[uVar10 + 1]._M_base._M_i & 1U) != 0);
        bVar15 = 0x1e < uVar10;
      }
LAB_01702b53:
      if (!bVar15) {
        if (pBVar13 == pBVar14) {
          uVar9 = (ulong)((uint)(this->super_ProducerBase).headIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        else {
          uVar9 = 0;
        }
        if (((this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) ==
            0) {
          uVar10 = 0x20;
        }
        else {
          uVar10 = (ulong)((uint)(this->super_ProducerBase).tailIndex.
                                 super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        do {
          if ((uVar10 == uVar9) && (pBVar13 == (this->super_ProducerBase).tailBlock)) break;
          plVar6 = *(long **)(pBVar13->elements + (ulong)((uint)uVar9 & 0x1f) * 0x18 + 8);
          if (plVar6 != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar1 = (int *)((long)plVar6 + 0xc);
              iVar5 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
            }
            else {
              iVar5 = *(int *)((long)plVar6 + 0xc);
              *(int *)((long)plVar6 + 0xc) = iVar5 + -1;
            }
            if (iVar5 == 1) {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x20);
      }
    } while (pBVar13 != (this->super_ProducerBase).tailBlock);
  }
  pBVar13 = (this->super_ProducerBase).tailBlock;
  if (pBVar13 != (Block *)0x0) {
    do {
      pBVar14 = pBVar13->next;
      if (pBVar13->dynamicallyAllocated == true) {
        free(pBVar13);
      }
      else {
        pCVar7 = (this->super_ProducerBase).parent;
        LOCK();
        paVar3 = &pBVar13->freeListRefs;
        _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        (paVar3->super___atomic_base<unsigned_int>)._M_i =
             (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
        UNLOCK();
        if (_Var4 == 0) {
          pBVar11 = (pCVar7->freeList).freeListHead._M_b._M_p;
          do {
            (pBVar13->freeListNext)._M_b._M_p = pBVar11;
            (pBVar13->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
            pFVar2 = &pCVar7->freeList;
            LOCK();
            pBVar12 = (pFVar2->freeListHead)._M_b._M_p;
            bVar15 = pBVar11 == pBVar12;
            if (bVar15) {
              (pFVar2->freeListHead)._M_b._M_p = pBVar13;
              pBVar12 = pBVar11;
            }
            UNLOCK();
            if (bVar15) break;
            LOCK();
            paVar3 = &pBVar13->freeListRefs;
            _Var4 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
            (paVar3->super___atomic_base<unsigned_int>)._M_i =
                 (paVar3->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
            UNLOCK();
            pBVar11 = pBVar12;
          } while (_Var4 == 1);
        }
      }
      pBVar13 = pBVar14;
    } while (pBVar14 != (this->super_ProducerBase).tailBlock);
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar8 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar8;
  }
  return;
}

Assistant:

~ExplicitProducer()
		{
			// Destruct any elements not yet dequeued.
			// Since we're in the destructor, we can assume all elements
			// are either completely dequeued or completely not (no halfways).
			if (this->tailBlock != nullptr) {		// Note this means there must be a block index too
				// First find the block that's partially dequeued, if any
				Block* halfDequeuedBlock = nullptr;
				if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
					// The head's not on a block boundary, meaning a block somewhere is partially dequeued
					// (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
					size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
					while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
						i = (i + 1) & (pr_blockIndexSize - 1);
					}
					assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
					halfDequeuedBlock = pr_blockIndexEntries[i].block;
				}
				
				// Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
				auto block = this->tailBlock;
				do {
					block = block->next;
					if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
						continue;
					}
					
					size_t i = 0;	// Offset into block
					if (block == halfDequeuedBlock) {
						i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					}
					
					// Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
					auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
						(*block)[i++]->~T();
					}
				} while (block != this->tailBlock);
			}
			
			// Destroy all blocks that we own
			if (this->tailBlock != nullptr) {
				auto block = this->tailBlock;
				do {
					auto nextBlock = block->next;
					if (block->dynamicallyAllocated) {
						destroy(block);
					}
					else {
						this->parent->add_block_to_free_list(block);
					}
					block = nextBlock;
				} while (block != this->tailBlock);
			}
			
			// Destroy the block indices
			auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
			while (header != nullptr) {
				auto prev = static_cast<BlockIndexHeader*>(header->prev);
				header->~BlockIndexHeader();
				(Traits::free)(header);
				header = prev;
			}
		}